

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerUpdateNewScObjectCache
          (Lowerer *this,Instr *insertInstr,Opnd *dst,Opnd *src1,bool isCtorFunction)

{
  uint32 uVar1;
  LabelInstr *target;
  RegOpnd *this_00;
  RegOpnd *pRVar2;
  RegOpnd *pRVar3;
  IndirOpnd *pIVar4;
  IntConstOpnd *compareSrc2;
  BranchInstr *branchInstr_00;
  LabelInstr *instr_00;
  HelperCallOpnd *newSrc;
  Instr *this_01;
  HelperCallOpnd *opndHelper;
  IndirOpnd *indirOpnd;
  RegOpnd *r3;
  Instr *instr;
  IndirOpnd *opndIndir;
  RegOpnd *r2;
  BranchInstr *branchInstr;
  IntConstOpnd *intOpnd;
  IndirOpnd *indirOpnd_1;
  RegOpnd *r1;
  RegOpnd *src1RegOpnd;
  LabelInstr *labelFallThru;
  bool isCtorFunction_local;
  Opnd *src1_local;
  Opnd *dst_local;
  Instr *insertInstr_local;
  Lowerer *this_local;
  
  target = IR::LabelInstr::New(Label,this->m_func,false);
  this_00 = GetRegOpnd(this,src1,insertInstr,this->m_func,TyInt64);
  if (!isCtorFunction) {
    pRVar2 = IR::Opnd::AsRegOpnd(&this_00->super_Opnd);
    pRVar3 = IR::RegOpnd::New(TyInt64,this->m_func);
    uVar1 = Js::RecyclableObject::GetOffsetOfType();
    pIVar4 = IR::IndirOpnd::New(pRVar2,uVar1,TyInt64,this->m_func,false);
    InsertMove(&pRVar3->super_Opnd,&pIVar4->super_Opnd,insertInstr,true);
    uVar1 = Js::Type::GetOffsetOfTypeId();
    pIVar4 = IR::IndirOpnd::New(pRVar3,uVar1,TyInt32,this->m_func,false);
    compareSrc2 = IR::IntConstOpnd::New(0x1b,TyInt32,this->m_func,true);
    branchInstr_00 =
         InsertCompareBranch(this,&pIVar4->super_Opnd,&compareSrc2->super_Opnd,BrNeq_A,target,
                             insertInstr,false);
    InsertObjectPoison(&pRVar2->super_Opnd,branchInstr_00,insertInstr,false);
  }
  pRVar2 = IR::RegOpnd::New(TyVar,this->m_func);
  pRVar3 = IR::Opnd::AsRegOpnd(&this_00->super_Opnd);
  uVar1 = Js::JavascriptFunction::GetOffsetOfConstructorCache();
  pIVar4 = IR::IndirOpnd::New(pRVar3,uVar1,TyInt64,this->m_func,false);
  InsertMove(&pRVar2->super_Opnd,&pIVar4->super_Opnd,insertInstr,true);
  pRVar3 = IR::RegOpnd::New(TyInt8,this->m_func);
  uVar1 = Js::ConstructorCache::GetOffsetOfUpdateAfterCtor();
  pIVar4 = IR::IndirOpnd::New(pRVar2,uVar1,TyUint8,this->m_func,false);
  InsertMove(&pRVar3->super_Opnd,&pIVar4->super_Opnd,insertInstr,true);
  InsertTestBranch(&pRVar3->super_Opnd,&pRVar3->super_Opnd,BrEq_A,target,insertInstr);
  instr_00 = IR::LabelInstr::New(Label,this->m_func,true);
  IR::Instr::InsertBefore(insertInstr,&instr_00->super_Instr);
  newSrc = IR::HelperCallOpnd::New(HelperUpdateNewScObjectCache,this->m_func);
  LoadScriptContext(this,insertInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,insertInstr,dst);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,insertInstr,&this_00->super_Opnd);
  this_01 = IR::Instr::New(Call,this->m_func);
  IR::Instr::SetSrc1(this_01,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertInstr,this_01);
  LowererMD::LowerCall(&this->m_lowererMD,this_01,0);
  IR::Instr::InsertBefore(insertInstr,&target->super_Instr);
  return insertInstr;
}

Assistant:

IR::Instr *
Lowerer::LowerUpdateNewScObjectCache(IR::Instr * insertInstr, IR::Opnd *dst, IR::Opnd *src1, const bool isCtorFunction)
{
    // if (!isCtorFunction)
    // {
    //     MOV r1, [src1 + offset(type)]       -- check base TypeIds_Function
    //     CMP [r1 + offset(typeId)], TypeIds_Function
    // }
    // JNE $fallThru
    // MOV r2, [src1 + offset(constructorCache)]
    // MOV r3, [r2 + offset(updateAfterCtor)]
    // TEST r3, r3                         -- check if updateAfterCtor is 0
    // JEQ $fallThru
    // CALL UpdateNewScObjectCache(src1, dst, scriptContext)
    // $fallThru:
    IR::LabelInstr *labelFallThru = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    src1 = GetRegOpnd(src1, insertInstr, m_func, TyMachReg);

    // Check if constructor is a function if we don't already know it.
    if (!isCtorFunction)
    {
        IR::RegOpnd* src1RegOpnd = src1->AsRegOpnd();
        //  MOV r1, [src1 + offset(type)]       -- check base TypeIds_Function
        IR::RegOpnd *r1 = IR::RegOpnd::New(TyMachReg, this->m_func);
        IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(src1RegOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
        Lowerer::InsertMove(r1, indirOpnd, insertInstr);

        // CMP [r1 + offset(typeId)], TypeIds_Function
        // JNE $fallThru
        indirOpnd = IR::IndirOpnd::New(r1, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func);
        IR::IntConstOpnd *intOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, this->m_func, true);
        IR::BranchInstr* branchInstr = InsertCompareBranch(indirOpnd, intOpnd, Js::OpCode::BrNeq_A, labelFallThru, insertInstr);
        InsertObjectPoison(src1RegOpnd, branchInstr, insertInstr, false);
    }

    // Every function has a constructor cache, even if only the default blank one.
    // r2 = MOV JavascriptFunction->constructorCache
    IR::RegOpnd *r2 = IR::RegOpnd::New(TyVar, this->m_func);
    IR::IndirOpnd *opndIndir = IR::IndirOpnd::New(src1->AsRegOpnd(), Js::JavascriptFunction::GetOffsetOfConstructorCache(), TyMachReg, this->m_func);
    IR::Instr *instr = Lowerer::InsertMove(r2, opndIndir, insertInstr);

    // r3 = constructorCache->updateAfterCtor
    IR::RegOpnd *r3 = IR::RegOpnd::New(TyInt8, this->m_func);
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(r2, Js::ConstructorCache::GetOffsetOfUpdateAfterCtor(), TyUint8, this->m_func);
    instr = Lowerer::InsertMove(r3, indirOpnd, insertInstr);

    // TEST r3, r3                         -- check if updateAfterCtor is 0
    // JEQ $fallThru
    InsertTestBranch(r3, r3, Js::OpCode::BrEq_A, labelFallThru, insertInstr);

    // r2 = UpdateNewScObjectCache(src1, dst, scriptContext)
    insertInstr->InsertBefore(IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true)); // helper label for uncommon path
    IR::HelperCallOpnd * opndHelper = IR::HelperCallOpnd::New(IR::HelperUpdateNewScObjectCache, m_func);

    LoadScriptContext(insertInstr);
    m_lowererMD.LoadHelperArgument(insertInstr, dst);
    m_lowererMD.LoadHelperArgument(insertInstr, src1);

    instr = IR::Instr::New(Js::OpCode::Call, m_func);
    instr->SetSrc1(opndHelper);
    insertInstr->InsertBefore(instr);
    m_lowererMD.LowerCall(instr, 0);

    // $fallThru:
    insertInstr->InsertBefore(labelFallThru);

    return insertInstr;
}